

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReaderTests.cpp
# Opt level: O0

int testStorageReaderTestsTruncatedHeader(void)

{
  initializer_list<unsigned_short> __l;
  string *psVar1;
  ostream *poVar2;
  Span<unsigned_short,_18446744073709551615UL> SVar3;
  Span<unsigned_short,_18446744073709551615UL> data;
  range_error *ex;
  undefined1 local_b8 [7];
  bool caughtCorrectException;
  StorageReader local_98;
  StorageReader reader;
  allocator<unsigned_short> local_69;
  unsigned_short local_68 [4];
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> bytes;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile
            ((AutoDeleteTempFile *)
             &bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 2;
  local_68[3] = 0;
  local_60 = local_68;
  local_58 = 4;
  std::allocator<unsigned_short>::allocator(&local_69);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50,__l,&local_69);
  std::allocator<unsigned_short>::~allocator(&local_69);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)
                      &bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  SVar3 = MILBlob::Util::MakeSpan<unsigned_short,_std::vector,_std::allocator<unsigned_short>_>
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
  data.m_ptr = SVar3.m_size.m_size;
  reader.m_impl._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl =
       (unique_ptr<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
        )SVar3.m_ptr;
  data.m_size.m_size =
       (size_t)reader.m_impl._M_t.
               super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
               .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl;
  MILBlob::TestUtil::WriteBlobFile<unsigned_short,18446744073709551615ul>
            ((TestUtil *)psVar1,
             (string *)
             reader.m_impl._M_t.
             super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
             .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl,data);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)
                      &bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)local_b8,(string *)psVar1);
  MILBlob::Blob::StorageReader::StorageReader(&local_98,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  MILBlob::Blob::StorageReader::GetDataView<float>(&local_98,0x28);
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x42);
  std::operator<<(poVar2,": expected exception, but none thrown.\n");
  MILBlob::Blob::StorageReader::~StorageReader(&local_98);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile
            ((AutoDeleteTempFile *)
             &bytes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return 1;
}

Assistant:

int testStorageReaderTestsTruncatedHeader()
{
    AutoDeleteTempFile tempfile;

    {
        // count=0, version=2
        std::vector<uint16_t> bytes{0x0000, 0x0000, 0x0002, 0x0000};
        TestUtil::WriteBlobFile(tempfile.GetFilename(), Util::MakeSpan(bytes));
    }

    StorageReader reader(tempfile.GetFilename());
    ML_ASSERT_THROWS_WITH_MESSAGE(reader.GetDataView<float>(40), std::range_error, "index out of bounds");

    return 0;
}